

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O2

UChar __thiscall icu_63::UCharCharacterIterator::next(UCharCharacterIterator *this)

{
  int iVar1;
  UChar UVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = (this->super_CharacterIterator).pos;
  iVar4 = iVar1 + 1;
  iVar3 = (this->super_CharacterIterator).end;
  UVar2 = L'\xffff';
  if (iVar4 < iVar3) {
    UVar2 = this->text[(long)iVar1 + 1];
    iVar3 = iVar4;
  }
  (this->super_CharacterIterator).pos = iVar3;
  return UVar2;
}

Assistant:

UChar
UCharCharacterIterator::next() {
    if (pos + 1 < end) {
        return text[++pos];
    } else {
        /* make current() return DONE */
        pos = end;
        return DONE;
    }
}